

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool CMeshClosestPointMapper::RTreeCallback(void *a_context,ON__INT_PTR a_id)

{
  int iVar1;
  int local_2c;
  void *local_28;
  CMeshClosestPointMapper *mapper;
  ON__INT_PTR a_id_local;
  void *a_context_local;
  
  if (a_context == (void *)0x0) {
    a_context_local._7_1_ = false;
  }
  else {
    local_28 = a_context;
    mapper = (CMeshClosestPointMapper *)a_id;
    a_id_local = (ON__INT_PTR)a_context;
    iVar1 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)((long)a_context + 0x30));
    if (iVar1 < 0x3e9) {
      local_2c = (int)mapper;
      ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)((long)local_28 + 0x30),&local_2c);
      a_context_local._7_1_ = true;
    }
    else {
      a_context_local._7_1_ = false;
    }
  }
  return a_context_local._7_1_;
}

Assistant:

static bool RTreeCallback(void* a_context, ON__INT_PTR a_id)
	{
		if (nullptr == a_context)
			return false;
		CMeshClosestPointMapper& mapper = *(CMeshClosestPointMapper*)a_context;

		// Jussi, Apr 25 2024, RH-81671:
		// Stop collecting faces. There's probably a mismatch between the mapping and the geometry.
		if (mapper.m_resFis.Count() > 1000)
			return false;

		mapper.m_resFis.Append((int)a_id);

		return true;
	}